

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O3

bool __thiscall crnlib::mipmapped_texture::is_flipped(mipmapped_texture *this)

{
  vector<crnlib::mip_level_*> *pvVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar2 = (ulong)(this->m_faces).m_size;
  if (uVar2 != 0) {
    pvVar1 = (this->m_faces).m_p;
    bVar6 = true;
    uVar3 = 0;
    do {
      uVar4 = (ulong)pvVar1[uVar3].m_size;
      if (uVar4 != 0) {
        uVar5 = 0;
        do {
          if ((pvVar1[uVar3].m_p[uVar5]->m_orient_flags &
              (cOrientationFlagYFlipped|cOrientationFlagXFlipped)) != cDefaultOrientationFlags) {
            return bVar6;
          }
          uVar5 = uVar5 + 1;
        } while (uVar4 != uVar5);
      }
      uVar3 = uVar3 + 1;
      bVar6 = uVar3 < uVar2;
    } while (uVar3 != uVar2);
  }
  return false;
}

Assistant:

bool mipmapped_texture::is_flipped() const {
  for (uint l = 0; l < m_faces.size(); l++)
    for (uint m = 0; m < m_faces[l].size(); m++)
      if (m_faces[l][m]->is_flipped())
        return true;

  return false;
}